

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

char duckdb::SignOperator::Operation<duckdb::uhugeint_t,signed_char>(uhugeint_t input)

{
  char cVar1;
  byte bVar2;
  uhugeint_t uStack_38;
  uhugeint_t local_28;
  
  bVar2 = 0;
  duckdb::uhugeint_t::uhugeint_t(&uStack_38,0);
  cVar1 = duckdb::uhugeint_t::operator==(&local_28,&uStack_38);
  if (cVar1 == '\0') {
    duckdb::uhugeint_t::uhugeint_t(&uStack_38,0);
    cVar1 = duckdb::uhugeint_t::operator>(&local_28,&uStack_38);
    bVar2 = cVar1 - 1U | 1;
  }
  return bVar2;
}

Assistant:

static TR Operation(TA input) {
		if (input == TA(0)) {
			return 0;
		} else if (input > TA(0)) {
			return 1;
		} else {
			return -1;
		}
	}